

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

int luv_fs_fchown(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  lua_Integer lVar4;
  lua_Integer lVar5;
  uv_fs_t *req;
  luv_req_t *plVar6;
  uv_loop_t *loop;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  code *cb;
  
  lVar3 = luaL_checkinteger(L,1);
  lVar4 = luaL_checkinteger(L,2);
  lVar5 = luaL_checkinteger(L,3);
  iVar1 = luv_check_continuation(L,4);
  req = (uv_fs_t *)lua_newuserdata(L,0x1b8);
  plVar6 = luv_setup_req(L,iVar1);
  req->data = plVar6;
  iVar1 = plVar6->callback_ref;
  loop = luv_loop(L);
  cb = (uv_fs_cb)0x0;
  if (iVar1 != -2) {
    cb = luv_fs_cb;
  }
  iVar2 = uv_fs_fchown(loop,req,(uv_file)lVar3,(uv_uid_t)lVar4,(uv_gid_t)lVar5,cb);
  if ((req->fs_type == UV_FS_ACCESS) || (-1 < iVar2)) {
    if (iVar1 == -2) {
      iVar1 = push_fs_result(L,req);
      if (req->fs_type != UV_FS_SCANDIR) {
        luv_cleanup_req(L,(luv_req_t *)req->data);
        req->data = (void *)0x0;
        uv_fs_req_cleanup(req);
      }
    }
    else {
      lua_rawgeti(L,-0xf4628,(long)plVar6->req_ref);
      iVar1 = 1;
    }
  }
  else {
    lua_pushnil(L);
    pcVar9 = req->path;
    pcVar7 = uv_err_name((int)req->result);
    pcVar8 = uv_strerror((int)req->result);
    if (pcVar9 == (char *)0x0) {
      lua_pushfstring(L,"%s: %s",pcVar7,pcVar8);
    }
    else {
      lua_pushfstring(L,"%s: %s: %s",pcVar7,pcVar8,req->path);
    }
    pcVar9 = uv_err_name((int)req->result);
    lua_pushstring(L,pcVar9);
    luv_cleanup_req(L,(luv_req_t *)req->data);
    req->data = (void *)0x0;
    uv_fs_req_cleanup(req);
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

static int luv_fs_fchown(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  uv_file file = luaL_checkinteger(L, 1);
  uv_uid_t uid = luaL_checkinteger(L, 2);
  uv_uid_t gid = luaL_checkinteger(L, 3);
  int ref = luv_check_continuation(L, 4);
  uv_fs_t* req = (uv_fs_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);
  FS_CALL(fchown, req, file, uid, gid);
}